

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O0

void __thiscall PatternGrid::dragMoveEvent(PatternGrid *this,QDragMoveEvent *evt)

{
  bool bVar1;
  int *piVar2;
  PatternCursorBase PVar3;
  int local_68 [4];
  PatternCursorBase local_58;
  QPoint local_48;
  undefined1 local_3c [8];
  PatternCursor cursor;
  QPoint pos;
  QDragMoveEvent *evt_local;
  PatternGrid *this_local;
  
  join_0x00001240_0x00001200_ = QDropEvent::position((QDropEvent *)evt);
  local_48 = QPointF::toPoint((QPointF *)&cursor.super_PatternCursorBase.column);
  PVar3 = (PatternCursorBase)mouseToCursor(this,local_48);
  local_58._0_8_ = PVar3._0_8_;
  local_3c._0_4_ = local_58.row;
  local_3c._4_4_ = local_58.column;
  local_58.track = PVar3.track;
  cursor.super_PatternCursorBase.row = local_58.track;
  local_68[3] = 0;
  local_68[2] = 0xb;
  local_58 = PVar3;
  piVar2 = std::clamp<int>((int *)(local_3c + 4),local_68 + 3,local_68 + 2);
  local_3c._4_4_ = *piVar2;
  local_68[1] = 0;
  local_68[0] = 3;
  piVar2 = std::clamp<int>((int *)&cursor,local_68 + 1,local_68);
  cursor.super_PatternCursorBase.row = *piVar2;
  bVar1 = operator!=<PatternCursor,_nullptr>((PatternCursor *)local_3c,&this->mDragPos);
  if (bVar1) {
    (this->mDragPos).super_PatternCursorBase.row = local_3c._0_4_;
    (this->mDragPos).super_PatternCursorBase.column = local_3c._4_4_;
    (this->mDragPos).super_PatternCursorBase.track = cursor.super_PatternCursorBase.row;
    QWidget::update();
  }
  return;
}

Assistant:

void PatternGrid::dragMoveEvent(QDragMoveEvent *evt) {

    auto pos = evt->position().toPoint();

    auto cursor = mouseToCursor(pos);
    cursor.column = std::clamp(cursor.column, 0, PatternCursor::MAX_COLUMNS - 1);
    cursor.track = std::clamp(cursor.track, 0, PatternCursor::MAX_TRACKS - 1);
    //cursor.column = PatternSelection::selectColumn(cursor.column);
    if (cursor != mDragPos) {
        mDragPos = cursor;
        
        update();
    }


}